

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBufferWithStructuredProtoField<(absl::lts_20250127::log_internal::LogMessage::StringType)1>
          (LogMessage *this,StructuredProtoField field,string_view str)

{
  bool bVar1;
  Span<char> *pSVar2;
  unsigned_long uVar3;
  size_t sVar4;
  Span<char> *pSVar5;
  Span<char> *in_R8;
  Span<char> SVar6;
  Span<char> msg;
  Span<const_char> value;
  Span<char> encoded_remaining_copy;
  BufferSizeVisitor local_60;
  uint64_t local_58;
  _Variadic_union<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  a_Stack_50 [2];
  
  pSVar2 = LogMessageData::encoded_remaining
                     ((this->data_)._M_t.
                      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      .
                      super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                      ._M_head_impl);
  encoded_remaining_copy.ptr_ = pSVar2->ptr_;
  encoded_remaining_copy.len_ = pSVar2->len_;
  a_Stack_50[0]._8_8_ =
       field.value.
       super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       ._M_u._8_8_;
  a_Stack_50[1]._0_8_ =
       field.value.
       super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       ._16_8_;
  local_58 = field.field_number;
  a_Stack_50[0]._M_first._M_storage.
  super__Variant_base<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Move_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Copy_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Move_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Copy_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
  super__Variant_storage_alias<unsigned_long,_long,_unsigned_int,_int,_bool>._M_u =
       field.value.
       super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       ._M_u._M_first._M_storage.super__Variant_base<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Move_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Copy_assign_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Move_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Copy_ctor_alias<unsigned_long,_long,_unsigned_int,_int,_bool>.
       super__Variant_storage_alias<unsigned_long,_long,_unsigned_int,_int,_bool>._M_u;
  local_60.field_number = field.field_number;
  uVar3 = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<unsigned_long>,_BufferSizeVisitor_&&,_std::variant<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>_&>
            ::_S_vtable._M_arr
            [field.value.
             super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             .
             super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
             ._16_8_ & 0xff]._M_data)
                    (&local_60,
                     (variant<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
                      *)&a_Stack_50[0]._M_first);
  sVar4 = BufferSizeFor(1,kLengthDelimited);
  SVar6 = EncodeMessageStart(7,(uint64_t)((pointer)str._M_len + uVar3 + sVar4),
                             &encoded_remaining_copy);
  bVar1 = EncodeStructuredProtoField(field,&encoded_remaining_copy);
  if (bVar1) {
    pSVar2 = &encoded_remaining_copy;
    value.len_ = (size_type)pSVar2;
    value.ptr_ = (pointer)str._M_len;
    bVar1 = EncodeBytesTruncate((log_internal *)0x1,(uint64_t)str._M_str,value,in_R8);
    if (bVar1) {
      msg.len_ = (size_type)&encoded_remaining_copy;
      msg.ptr_ = (pointer)SVar6.len_;
      EncodeMessageLength((log_internal *)SVar6.ptr_,msg,pSVar2);
      pSVar2 = LogMessageData::encoded_remaining
                         ((this->data_)._M_t.
                          super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                          .
                          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                          ._M_head_impl);
      pSVar2->ptr_ = encoded_remaining_copy.ptr_;
      pSVar2->len_ = encoded_remaining_copy.len_;
      return;
    }
  }
  pSVar2 = LogMessageData::encoded_remaining
                     ((this->data_)._M_t.
                      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      .
                      super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                      ._M_head_impl);
  pSVar5 = LogMessageData::encoded_remaining
                     ((this->data_)._M_t.
                      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      .
                      super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                      ._M_head_impl);
  Span<char>::remove_suffix(pSVar2,pSVar5->len_);
  return;
}

Assistant:

void LogMessage::CopyToEncodedBufferWithStructuredProtoField(
    StructuredProtoField field, absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  size_t encoded_field_size = BufferSizeForStructuredProtoField(field);
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto start = EncodeMessageStart(
      EventTag::kValue,
      encoded_field_size +
          BufferSizeFor(tag_value, WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);

  // Write the encoded proto field.
  if (!EncodeStructuredProtoField(field, encoded_remaining_copy)) {
    // The header / field will not fit; zero `encoded_remaining()` so we
    // don't write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
    return;
  }

  // Write the string, truncating if necessary.
  if (!EncodeStringTruncate(ValueTag::kString, str, &encoded_remaining_copy)) {
    // The length of the string itself did not fit; zero `encoded_remaining()`
    // so the value is not encoded at all.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
    return;
  }

  EncodeMessageLength(start, &encoded_remaining_copy);
  data_->encoded_remaining() = encoded_remaining_copy;
}